

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void service_stop(service *svc)

{
  svc->flags = (svc->flags & 0xfffffff2) + 1;
  if (svc->pid != 0) {
    log_write(5,"<5>init: service \'%s\' is being killed\n");
    kill(-svc->pid,0xf);
    notify_service_state(svc->name,"stopping");
    return;
  }
  notify_service_state(svc->name,"stopped");
  return;
}

Assistant:

void service_stop(struct service *svc)
{
        /* we are no longer running, nor should we
         * attempt to restart
         */
    svc->flags &= (~(SVC_RUNNING|SVC_RESTARTING));

        /* if the service has not yet started, prevent
         * it from auto-starting with its class
         */
    svc->flags |= SVC_DISABLED;

    if (svc->pid) {
        NOTICE("service '%s' is being killed\n", svc->name);
        kill(-svc->pid, SIGTERM);
        notify_service_state(svc->name, "stopping");
    } else {
        notify_service_state(svc->name, "stopped");
    }
}